

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

SQInteger __thiscall
SQArray::Next(SQArray *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQString *pSVar1;
  SQUnsignedInteger pos;
  SQUnsignedInteger SVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *in_RSI;
  SQObjectPtr *in_RDI;
  SQObjectPtr *o;
  SQUnsignedInteger idx;
  SQUnsignedInteger x;
  SQSharedState *obj;
  SQTable *this_00;
  long local_8;
  
  pos = TranslateIndex(in_RSI);
  x = pos;
  SVar2 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 3));
  if (x < SVar2) {
    ::SQObjectPtr::operator=(in_RDI,x);
    pSVar3 = sqvector<SQObjectPtr>::operator[]((sqvector<SQObjectPtr> *)(in_RDI + 3),pos);
    if ((pSVar3->super_SQObject)._type == OT_WEAKREF) {
      pSVar1 = (pSVar3->super_SQObject)._unVal.pString;
      obj = pSVar1->_sharedstate;
      this_00 = (SQTable *)pSVar1->_next;
    }
    else {
      obj = *(SQSharedState **)&pSVar3->super_SQObject;
      this_00 = (pSVar3->super_SQObject)._unVal.pTable;
    }
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQObject *)obj);
    local_8 = pos + 1;
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

SQInteger Next(const SQObjectPtr &refpos,SQObjectPtr &outkey,SQObjectPtr &outval)
    {
        SQUnsignedInteger idx=TranslateIndex(refpos);
        while(idx<_values.size()){
            //first found
            outkey=(SQInteger)idx;
            SQObjectPtr &o = _values[idx];
            outval = _realval(o);
            //return idx for the next iteration
            return ++idx;
        }
        //nothing to iterate anymore
        return -1;
    }